

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O3

void __thiscall fasttext::DenseMatrix::addRowToVector(DenseMatrix *this,Vector *x,int32_t i,real a)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  float *pfVar4;
  float *pfVar5;
  undefined1 auVar6 [16];
  int64_t iVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0x91,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const"
                 );
  }
  iVar7 = Matrix::size(&this->super_Matrix,0);
  if ((long)(ulong)(uint)i < iVar7) {
    sVar1 = (x->data_).size_;
    sVar8 = Matrix::size(&this->super_Matrix,1);
    if (sVar1 != sVar8) {
      __assert_fail("x.size() == this->size(1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                    ,0x93,
                    "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const"
                   );
    }
    lVar2 = (this->super_Matrix).n_;
    if (0 < lVar2) {
      lVar10 = (ulong)(uint)i * lVar2;
      uVar3 = (this->data_).size_;
      pfVar4 = (x->data_).mem_;
      lVar9 = 0;
      pfVar5 = (this->data_).mem_;
      do {
        if (uVar3 <= (ulong)(lVar10 + lVar9)) {
          __assert_fail("i * n_ + j < data_.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.h"
                        ,0x31,"const real &fasttext::DenseMatrix::at(int64_t, int64_t) const");
        }
        auVar6 = vfmadd213ss_fma(ZEXT416((uint)pfVar5[lVar10 + lVar9]),ZEXT416((uint)a),
                                 ZEXT416((uint)pfVar4[lVar9]));
        pfVar4[lVar9] = auVar6._0_4_;
        lVar9 = lVar9 + 1;
      } while (lVar2 != lVar9);
    }
    return;
  }
  __assert_fail("i < this->size(0)",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                ,0x92,
                "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const")
  ;
}

Assistant:

void DenseMatrix::addRowToVector(Vector& x, int32_t i, real a) const {
  assert(i >= 0);
  assert(i < this->size(0));
  assert(x.size() == this->size(1));
  for (int64_t j = 0; j < n_; j++) {
    x[j] += a * at(i, j);
  }
}